

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_algebraic.h
# Opt level: O2

bool __thiscall
mp::AlgebraicExpression<mp::LinTerms>::is_variable(AlgebraicExpression<mp::LinTerms> *this)

{
  if (((this->constant_term_ == 0.0) && (!NAN(this->constant_term_))) &&
     ((this->super_LinTerms).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_size == 1)) {
    return (bool)(-(*(this->super_LinTerms).coefs_.
                     super_small_vector_base<std::allocator<double>,_6U>.m_data.
                     super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr == 1.0) & 1);
  }
  return false;
}

Assistant:

double constant_term() const { return constant_term_; }